

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# locdspnm.cpp
# Opt level: O0

UnicodeString * __thiscall
icu_63::ICUDataTable::getNoFallback
          (ICUDataTable *this,char *tableKey,char *subTableKey,char *itemKey,UnicodeString *result)

{
  char *path;
  UBool UVar1;
  char *locale;
  UChar *srcChars;
  UChar *s;
  int32_t len;
  UErrorCode status;
  UnicodeString *result_local;
  char *itemKey_local;
  char *subTableKey_local;
  char *tableKey_local;
  ICUDataTable *this_local;
  
  s._4_4_ = U_ZERO_ERROR;
  s._0_4_ = 0;
  path = this->path;
  _len = (ICUDataTable *)result;
  result_local = (UnicodeString *)itemKey;
  itemKey_local = subTableKey;
  subTableKey_local = tableKey;
  tableKey_local = (char *)this;
  locale = Locale::getName(&this->locale);
  srcChars = uloc_getTableStringWithFallback_63
                       (path,locale,subTableKey_local,itemKey_local,(char *)result_local,
                        (int32_t *)&s,(UErrorCode *)((long)&s + 4));
  UVar1 = ::U_SUCCESS(s._4_4_);
  if (UVar1 == '\0') {
    UnicodeString::setToBogus((UnicodeString *)_len);
    this_local = _len;
  }
  else {
    this_local = (ICUDataTable *)UnicodeString::setTo((UnicodeString *)_len,srcChars,(int32_t)s);
  }
  return (UnicodeString *)this_local;
}

Assistant:

UnicodeString &
ICUDataTable::getNoFallback(const char* tableKey, const char* subTableKey, const char* itemKey,
                            UnicodeString& result) const {
  UErrorCode status = U_ZERO_ERROR;
  int32_t len = 0;

  const UChar *s = uloc_getTableStringWithFallback(path, locale.getName(),
                                                   tableKey, subTableKey, itemKey,
                                                   &len, &status);
  if (U_SUCCESS(status)) {
    return result.setTo(s, len);
  }

  result.setToBogus();
  return result;
}